

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O1

void __thiscall
CTcGenTarg::build_local_symbol_records(CTcGenTarg *this,CTcCodeStream *cs,CVmHashTable *tab)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  char **ppcVar4;
  CVmHashEntry *pCVar5;
  uint32_t tmp_1;
  uint uVar6;
  CVmHashEntry *this_00;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint16_t tmp;
  uint uVar14;
  char nbuf [81];
  undefined4 local_b4;
  uint local_b0;
  uint local_ac;
  CVmHashTable *local_a8;
  CTcStreamAnchor *local_a0;
  CTcStreamAnchor *local_98;
  CTcCodeStream *local_90;
  char local_88 [88];
  void *__buf;
  
  if (1 < G_sizes.dbg_fmt_vsn) {
    local_90 = cs;
    local_a8 = tab;
    for (local_a0 = (cs->super_CTcDataStream).first_anchor_; local_a0 != (CTcStreamAnchor *)0x0;
        local_a0 = local_a0->nxt_) {
      uVar3 = local_a0->ofs_;
      ppcVar4 = (cs->super_CTcDataStream).pages_;
      uVar7 = (uVar3 + 8) / 65000;
      uVar8 = (uVar3 + 9) / 65000;
      if (CONCAT11(ppcVar4[uVar8][uVar8 * -65000 + uVar3 + 9],
                   ppcVar4[uVar7][uVar7 * -65000 + uVar3 + 8]) != 0) {
        lVar11 = uVar3 + (uint)CONCAT11(ppcVar4[uVar8][uVar8 * -65000 + uVar3 + 9],
                                        ppcVar4[uVar7][uVar7 * -65000 + uVar3 + 8]);
        uVar7 = lVar11 + G_sizes.dbg_hdr;
        uVar8 = lVar11 + G_sizes.dbg_hdr + 1;
        uVar13 = (ulong)((uint)CONCAT11(ppcVar4[uVar8 / 65000][uVar8 % 65000],
                                        ppcVar4[uVar7 / 65000][uVar7 % 65000]) * G_sizes.dbg_line);
        uVar8 = uVar13 + uVar7 + 4;
        uVar12 = uVar13 + uVar7 + 5;
        local_b0 = (uint)CONCAT11(ppcVar4[uVar12 / 65000][uVar12 % 65000],
                                  ppcVar4[uVar8 / 65000][uVar8 % 65000]);
        if (local_b0 != 0) {
          lVar11 = uVar13 + uVar7 + (ulong)local_b0 * 2 + 6;
          local_ac = 0;
          do {
            ppcVar4 = (cs->super_CTcDataStream).pages_;
            uVar7 = (lVar11 + 2U) / 65000;
            lVar1 = lVar11 + uVar7 * -65000;
            uVar8 = (lVar11 + 3U) / 65000;
            lVar9 = uVar8 * -65000 + lVar11;
            lVar11 = G_sizes.dbg_frame + lVar11;
            for (uVar14 = (uint)CONCAT11(ppcVar4[uVar8][lVar9 + 3],ppcVar4[uVar7][lVar1 + 2]);
                uVar14 != 0; uVar14 = uVar14 - 1) {
              ppcVar4 = (cs->super_CTcDataStream).pages_;
              uVar7 = (lVar11 + 2U) / 65000;
              uVar8 = G_sizes.lcl_hdr + lVar11;
              if ((ppcVar4[uVar7][uVar7 * -65000 + lVar11 + 2] & 4U) == 0) {
                uVar7 = (uVar8 + 1) / 65000;
                lVar11 = CONCAT11(ppcVar4[uVar7][uVar7 * -65000 + uVar8 + 1],
                                  ppcVar4[uVar8 / 65000][uVar8 % 65000]) + uVar8 + 2;
              }
              else {
                uVar6 = CTcDataStream::readu4_at(&cs->super_CTcDataStream,uVar8);
                uVar7 = (ulong)uVar6;
                bVar2 = G_lcl_stream->pages_[uVar7 / 65000][uVar7 % 65000];
                uVar12 = (uVar7 + 1) / 65000;
                uVar10 = (uint)CONCAT11(G_lcl_stream->pages_[uVar12][uVar12 * -65000 + uVar7 + 1],
                                        bVar2);
                __buf = (void *)(ulong)uVar10;
                if (uVar10 < 0x51) {
                  CTcDataStream::copy_to_buf(G_lcl_stream,local_88,uVar7 + 2,(ulong)__buf);
                  this_00 = CVmHashTable::find(local_a8,local_88,(size_t)__buf);
                  if (this_00 == (CVmHashEntry *)0x0) {
                    local_98 = CTcDataStream::add_anchor
                                         (G_ds,(CTcSymbol *)0x0,(CTcAbsFixup **)0x0,G_ds->ofs_);
                    this_00 = (CVmHashEntry *)operator_new(0x38);
                    pCVar5 = (CVmHashEntry *)G_ds->ofs_;
                    __n = 1;
                    CVmHashEntry::CVmHashEntry(this_00,local_88,(size_t)__buf,1);
                    this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00310698;
                    this_00[1]._vptr_CVmHashEntry = (_func_int **)local_98;
                    this_00[1].nxt_ = pCVar5;
                    CVmHashTable::add(local_a8,this_00);
                    local_b4 = CONCAT22(local_b4._2_2_,(ushort)bVar2);
                    CTcDataStream::write(G_ds,(int)&local_b4,(void *)0x2,__n);
                    CTcDataStream::write(G_ds,(int)local_88,__buf,__n);
                  }
                  cs = local_90;
                  CTcAbsFixup::add_abs_fixup
                            ((CTcAbsFixup **)this_00[1]._vptr_CVmHashEntry[1],
                             &local_90->super_CTcDataStream,uVar8);
                  local_b4 = *(undefined4 *)&this_00[1].nxt_;
                  CTcDataStream::write_at(&cs->super_CTcDataStream,uVar8,(char *)&local_b4,4);
                }
                lVar11 = uVar8 + 4;
              }
            }
            local_ac = local_ac + 1;
          } while (local_ac != local_b0);
        }
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::build_local_symbol_records(CTcCodeStream *cs,
                                            CVmHashTable *tab)
{
    CTcStreamAnchor *anchor;

    /* this only applies for debug format 2+ */
    if (G_sizes.dbg_fmt_vsn < 2)
        return;

    /* go through the list of anchors in the code stream */
    for (anchor = cs->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong start_ofs;
        ulong dbg_ofs;
        uint cnt;
        ulong ofs;

        /* get the anchor's stream offset */
        start_ofs = anchor->get_ofs();

        /* read the debug table offset from the method header */
        dbg_ofs = start_ofs + cs->readu2_at(start_ofs + 8);

        /* if there's no debug table for this method, go on to the next */
        if (dbg_ofs == start_ofs)
            continue;

        /* read the number of line entries */
        ofs = dbg_ofs + G_sizes.dbg_hdr;
        cnt = cs->readu2_at(ofs);
        ofs += 2;

        /* skip past the line entries */
        ofs += cnt * G_sizes.dbg_line;

        /* skip the end offset */
        ofs += 2;

        /* read the frame count */
        uint frame_cnt = cs->readu2_at(ofs);
        ofs += 2;

        /* skip the frame index */
        ofs += 2 * frame_cnt;

        /* go through the individual frames */
        for (uint fi = 0 ; fi < frame_cnt ; ++fi)
        {
            /* get the number of entries */
            cnt = cs->readu2_at(ofs + 2);

            /* skip to the first entry */
            ofs += G_sizes.dbg_frame;

            /* parse each entry */
            for (uint i = 0 ; i < cnt ; ++i)
            {
                /* read the flags */
                uint flags = cs->readu2_at(ofs + 2);
                ofs += G_sizes.lcl_hdr;

                /* 
                 *   If this is an out-of-line entry, we currently have a
                 *   pointer to the local variable stream, and we need to
                 *   move it to the constant pool instead.  If it's in-line,
                 *   there's nothing to do - we just skip the record. 
                 */
                if (flags & 0x0004)
                {
                    /* 
                     *   It's a constant pool entry.  Read the name from the
                     *   local variable pool.  
                     */
                    ulong lofs = cs->readu4_at(ofs);
                    size_t nlen = G_lcl_stream->readu2_at(lofs);
                    if (nlen <= TOK_SYM_MAX_LEN)
                    {
                        /* read the name */
                        char nbuf[TOK_SYM_MAX_LEN + 1];
                        G_lcl_stream->copy_to_buf(nbuf, lofs + 2, nlen);

                        /* 
                         *   Look up the name in our symbol table, to see if
                         *   we've already defined it.  If so, re-use the
                         *   same name.  A few local variable names tend to
                         *   be used over and over, so it saves a lot of
                         *   space to share one copy for each instance of a
                         *   reused name. 
                         */
                        dbglcl *l = (dbglcl *)tab->find(nbuf, nlen);
                        if (l == 0)
                        {
                            /* add an anchor for the constant pool entry */
                            CTcStreamAnchor *anchor = G_ds->add_anchor(0, 0);

                            /* 
                             *   It's not already defined.  Add a new symbol
                             *   table entry for it.  The entry will go at
                             *   the current constant pool stream offset.  
                             */
                            l = new dbglcl(nbuf, nlen, anchor,
                                           G_ds->get_ofs());
                            tab->add(l);

                            /* copy the name to the constant pool stream */
                            G_ds->write2(nlen);
                            G_ds->write(nbuf, nlen);
                        }

                        /* add a fixup for this pointer in the code stream */
                        CTcAbsFixup::add_abs_fixup(
                            l->anchor->fixup_list_head_, cs, ofs);

                        /* 
                         *   Overwrite the local stream offset with the
                         *   constant pool offset of the symbol. 
                         */
                        cs->write4_at(ofs, l->ofs);
                    }

                    /* skip the record */
                    ofs += 4;
                }
                else
                {
                    /* it's in-line - just skip to the next record */
                    ofs += cs->readu2_at(ofs) + 2;
                }
            }
        }
    }
}